

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

shared_ptr<spdlog::logger> __thiscall spdlog::details::registry::default_logger(registry *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pthread_mutex_t *in_RSI;
  shared_ptr<spdlog::logger> sVar1;
  
  std::mutex::lock((mutex *)&in_RSI->__data);
  std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)((long)in_RSI + 0x130));
  pthread_mutex_unlock(in_RSI);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> registry::default_logger() {
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    return default_logger_;
}